

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_transaction.cpp
# Opt level: O2

void __thiscall
duckdb::MetaTransaction::RemoveTransaction(MetaTransaction *this,AttachedDatabase *db)

{
  iterator __it;
  reference pvVar1;
  InternalException *this_00;
  idx_t i;
  ulong __n;
  allocator local_49;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)db;
  __it = ::std::
         _Hashtable<std::reference_wrapper<duckdb::AttachedDatabase>,_std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::AttachedDatabase>,_duckdb::ReferenceHashFunction<duckdb::AttachedDatabase>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         ::find(&(this->transactions)._M_h,(key_type *)&local_48);
  if (__it.
      super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_48,
               "MetaTransaction::RemoveTransaction called but meta transaction did not have a transaction for this database"
               ,&local_49);
    InternalException::InternalException(this_00,&local_48);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::
  _Hashtable<std::reference_wrapper<duckdb::AttachedDatabase>,_std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::AttachedDatabase>,_duckdb::ReferenceHashFunction<duckdb::AttachedDatabase>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::erase(&(this->transactions)._M_h,
          (const_iterator)
          __it.
          super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>,_true>
          ._M_cur);
  __n = 0;
  while( true ) {
    if ((ulong)((long)(this->all_transactions).
                      super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->all_transactions).
                      super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) {
      return;
    }
    pvVar1 = vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true>::get<true>
                       (&this->all_transactions,__n);
    if (pvVar1->_M_data == db) break;
    __n = __n + 1;
  }
  vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true>::erase_at
            (&this->all_transactions,__n);
  return;
}

Assistant:

void MetaTransaction::RemoveTransaction(AttachedDatabase &db) {
	auto entry = transactions.find(db);
	if (entry == transactions.end()) {
		throw InternalException("MetaTransaction::RemoveTransaction called but meta transaction did not have a "
		                        "transaction for this database");
	}
	transactions.erase(entry);
	for (idx_t i = 0; i < all_transactions.size(); i++) {
		auto &db_entry = all_transactions[i];
		if (RefersToSameObject(db_entry.get(), db)) {
			all_transactions.erase_at(i);
			break;
		}
	}
}